

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O3

Abc_Ntk_t *
Abc_NtkFromSopsInt(Abc_Ntk_t *pNtk,int nCubeLim,int nBTLimit,int nCostMax,int fCanon,int fReverse,
                  int fCnfShared,int fVerbose)

{
  void *pvVar1;
  Abc_Obj_t *pObj;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Gia_Man_t *p;
  Vec_Wec_t *vSupps;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar5;
  char *pcVar6;
  char *__s2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pAVar7;
  ulong uVar8;
  long lVar9;
  Vec_Int_t *pVVar10;
  Abc_Obj_t *pAVar11;
  undefined4 in_register_0000008c;
  long lVar12;
  int iObjMax;
  Abc_Ntk_t *local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_0000008c,fReverse);
  p = Abc_NtkClpGia(pNtk);
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  if (0 < nCostMax && 0 < nCubeLim) {
    uVar2 = Gia_ManCoLargestSupp(p,vSupps);
    if (((int)uVar2 < 0) || (p->vCos->nSize <= (int)uVar2)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iObjMax = p->vCos->pArray[uVar2];
    if ((iObjMax < 0) || (p->nObjs <= iObjMax)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (vSupps->nSize <= (int)uVar2) {
LAB_002a3cb1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                    ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    uVar2 = vSupps->pArray[uVar2].nSize;
    uVar3 = Gia_ManConeSize(p,&iObjMax,1);
    uVar8 = (ulong)(uint)nCubeLim * (long)(int)uVar3 * (long)(int)uVar2;
    if ((uint)nCostMax <= uVar8 && uVar8 - (uint)nCostMax != 0) {
      printf("Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n",
             (ulong)uVar3,(ulong)uVar2,(ulong)(uint)nCubeLim,(ulong)(uint)nCostMax);
      Gia_ManStop(p);
      iVar4 = vSupps->nCap;
      pVVar10 = vSupps->pArray;
      if (iVar4 < 1) {
        if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_002a3c75;
      }
      else {
        lVar9 = 8;
        lVar12 = 0;
        do {
          pvVar1 = *(void **)((long)&pVVar10->nCap + lVar9);
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
            pVVar10 = vSupps->pArray;
            *(undefined8 *)((long)&pVVar10->nCap + lVar9) = 0;
            iVar4 = vSupps->nCap;
          }
          lVar12 = lVar12 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar12 < iVar4);
      }
      free(pVVar10);
LAB_002a3c75:
      free(vSupps);
      return (Abc_Ntk_t *)0x0;
    }
  }
  pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  __ptr = Abc_GiaDeriveSops(pNtkNew,p,vSupps,nCubeLim,nBTLimit,fReverse,fCanon,(int)local_38,
                            fCnfShared,fVerbose);
  Gia_ManStop(p);
  if (__ptr != (Vec_Ptr_t *)0x0) {
    pVVar5 = pNtk->vCos;
    if (0 < pVVar5->nSize) {
      lVar9 = 0;
      local_40 = pNtk;
      do {
        pAVar11 = (Abc_Obj_t *)pVVar5->pArray[lVar9];
        pObj = (Abc_Obj_t *)pAVar11->pNtk->vObjs->pArray[*(pAVar11->vFanins).pArray];
        uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
        if ((uVar2 == 5) || (uVar2 == 2)) {
          pcVar6 = Abc_ObjName(pAVar11);
          __s2 = Abc_ObjName(pObj);
          iVar4 = strcmp(pcVar6,__s2);
          if (iVar4 != 0) {
            uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
            goto LAB_002a39ff;
          }
          pAVar11 = (pAVar11->field_6).pCopy;
          pFanin = (pObj->field_6).pCopy;
LAB_002a3b29:
          Abc_ObjAddFanin(pAVar11,pFanin);
        }
        else {
LAB_002a39ff:
          if ((uVar2 == 5) || (uVar2 == 2)) {
            pFanin = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
            Abc_ObjAddFanin(pFanin,(pObj->field_6).pCopy);
            pcVar6 = "0 1\n";
            if ((*(uint *)&pAVar11->field_0x14 >> 10 & 1) == 0) {
              pcVar6 = "1 1\n";
            }
            pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,pcVar6);
            (pFanin->field_5).pData = pcVar6;
LAB_002a3b22:
            pAVar11 = (pAVar11->field_6).pCopy;
            goto LAB_002a3b29;
          }
          pAVar7 = Abc_AigConst1(pNtk);
          pFanin = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
          if (pObj != pAVar7) {
            if (lVar9 < vSupps->nSize) {
              pVVar10 = vSupps->pArray;
              if (0 < pVVar10[lVar9].nSize) {
                lVar12 = 0;
                do {
                  iVar4 = pVVar10[lVar9].pArray[lVar12];
                  if (((long)iVar4 < 0) || (pNtkNew->vCis->nSize <= iVar4)) goto LAB_002a3c92;
                  Abc_ObjAddFanin(pFanin,(Abc_Obj_t *)pNtkNew->vCis->pArray[iVar4]);
                  lVar12 = lVar12 + 1;
                } while (lVar12 < pVVar10[lVar9].nSize);
              }
              if (__ptr->nSize <= lVar9) {
LAB_002a3c92:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,(char *)__ptr->pArray[lVar9])
              ;
              (pFanin->field_5).pData = pcVar6;
              pNtk = local_40;
              if (pcVar6 == (char *)0x1) {
                __assert_fail("pNodeNew->pData != (void *)(ABC_PTRINT_T)1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcCollapse.c"
                              ,0x3a7,
                              "Abc_Ntk_t *Abc_NtkFromSopsInt(Abc_Ntk_t *, int, int, int, int, int, int, int)"
                             );
              }
              goto LAB_002a3b22;
            }
            goto LAB_002a3cb1;
          }
          pcVar6 = " 0\n";
          if ((*(uint *)&pAVar11->field_0x14 >> 10 & 1) == 0) {
            pcVar6 = " 1\n";
          }
          pcVar6 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,pcVar6);
          (pFanin->field_5).pData = pcVar6;
          Abc_ObjAddFanin((pAVar11->field_6).pCopy,pFanin);
          pNtk = local_40;
        }
        lVar9 = lVar9 + 1;
        pVVar5 = pNtk->vCos;
      } while (lVar9 < pVVar5->nSize);
    }
    iVar4 = vSupps->nCap;
    pVVar10 = vSupps->pArray;
    if (iVar4 < 1) {
      if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_002a3c23;
    }
    else {
      lVar9 = 8;
      lVar12 = 0;
      do {
        pvVar1 = *(void **)((long)&pVVar10->nCap + lVar9);
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
          pVVar10 = vSupps->pArray;
          *(undefined8 *)((long)&pVVar10->nCap + lVar9) = 0;
          iVar4 = vSupps->nCap;
        }
        lVar12 = lVar12 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar12 < iVar4);
    }
    free(pVVar10);
LAB_002a3c23:
    free(vSupps);
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    Abc_NtkSortSops(pNtkNew);
    return pNtkNew;
  }
  iVar4 = vSupps->nCap;
  pVVar10 = vSupps->pArray;
  if (iVar4 < 1) {
    if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_002a3c59;
  }
  else {
    lVar9 = 8;
    lVar12 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar10->nCap + lVar9);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar10 = vSupps->pArray;
        *(undefined8 *)((long)&pVVar10->nCap + lVar9) = 0;
        iVar4 = vSupps->nCap;
      }
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar12 < iVar4);
  }
  free(pVVar10);
LAB_002a3c59:
  free(vSupps);
  Abc_NtkDelete(pNtkNew);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromSopsInt( Abc_Ntk_t * pNtk, int nCubeLim, int nBTLimit, int nCostMax, int fCanon, int fReverse, int fCnfShared, int fVerbose )
{
    Abc_Ntk_t * pNtkNew;
    Gia_Man_t * pGia;
    Vec_Wec_t * vSupps;
    Vec_Int_t * vSupp;
    Vec_Ptr_t * vSops;
    Abc_Obj_t * pNode, * pNodeNew, * pDriver;
    int i, k, iCi; 
    pGia    = Abc_NtkClpGia( pNtk );
    vSupps  = Gia_ManCreateCoSupps( pGia, fVerbose );
    // check the largest output
    if ( nCubeLim > 0 && nCostMax > 0 )
    {
        int iCoMax   = Gia_ManCoLargestSupp( pGia, vSupps );
        int iObjMax  = Gia_ObjId( pGia, Gia_ManCo(pGia, iCoMax) );
        int nSuppMax = Vec_IntSize( Vec_WecEntry(vSupps, iCoMax) );
        int nNodeMax = Gia_ManConeSize( pGia, &iObjMax, 1 );
        word Cost = (word)nNodeMax * (word)nSuppMax * (word)nCubeLim;
        if ( Cost > (word)nCostMax )
        {
            printf( "Cost of the largest output cone exceeded the limit (%d * %d * %d  >  %d).\n", 
                nNodeMax, nSuppMax, nCubeLim, nCostMax );
            Gia_ManStop( pGia );
            Vec_WecFree( vSupps );
            return NULL;
        }
    }
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    vSops   = Abc_GiaDeriveSops( pNtkNew, pGia, vSupps, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    Gia_ManStop( pGia );
    if ( vSops == NULL )
    {
        Vec_WecFree( vSupps );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && !strcmp(Abc_ObjName(pNode), Abc_ObjName(pDriver)) )
        {
            Abc_ObjAddFanin( pNode->pCopy, pDriver->pCopy );
            continue;
        }
        if ( Abc_ObjIsCi(pDriver) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            Abc_ObjAddFanin( pNodeNew, pDriver->pCopy ); 
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? "0 1\n" : "1 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        if ( pDriver == Abc_AigConst1(pNtk) )
        {
            pNodeNew = Abc_NtkCreateNode( pNtkNew );
            pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pNode) ? " 0\n" : " 1\n" );
            Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
            continue;
        }
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        vSupp = Vec_WecEntry( vSupps, i );
        Vec_IntForEachEntry( vSupp, iCi, k )
            Abc_ObjAddFanin( pNodeNew, Abc_NtkCi(pNtkNew, iCi) );
        pNodeNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, (const char*)Vec_PtrEntry( vSops, i ) );
        assert( pNodeNew->pData != (void *)(ABC_PTRINT_T)1 );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Vec_WecFree( vSupps );
    Vec_PtrFree( vSops );
    Abc_NtkSortSops( pNtkNew );
    return pNtkNew;
}